

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableElimination.cpp
# Opt level: O0

ClauseIterator __thiscall
Inferences::ALASCA::VariableElimination::applyRule<Kernel::NumTraits<Kernel::RationalConstantType>>
          (VariableElimination *this,Clause *premise,
          FoundVariable<Kernel::NumTraits<Kernel::RationalConstantType>_> *found)

{
  RangeIterator<unsigned_int> i_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  AlascaPredicate AVar4;
  Elem EVar5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  uint *puVar10;
  TermList TVar11;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  *in_RCX;
  Clause *in_RDX;
  IteratorCore<Kernel::Clause_*> *in_RDI;
  RangeIterator<unsigned_int> RVar12;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *l2;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *l1;
  Elem i2;
  StlIter __end4;
  StlIter __begin4;
  IterTraits<Lib::RangeIterator<unsigned_int>_> *__range4_3;
  Elem i1;
  StlIter __end3;
  StlIter __begin3;
  IterTraits<Lib::RangeIterator<unsigned_int>_> *__range3_3;
  _func_Literal_ptr_bool_TermList_TermList *gr_2;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *l_1;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *__end0_5;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *__begin0_5;
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *__range4_2;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *j_1;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *__end0_4;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *__begin0_4;
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *__range3_2;
  _func_Literal_ptr_bool_TermList_TermList *gr_1;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *l;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *__end0_3;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *__begin0_3;
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *__range4_1;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *i_2;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *__end0_2;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *__begin0_2;
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *__range3_1;
  _func_Literal_ptr_bool_TermList_TermList *gr;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *j;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *__end0_1;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *__begin0_1;
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *__range4;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *i_1;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *__end0;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *__begin0;
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *__range3;
  anon_class_1_0_00000001_for_minus minus;
  anon_class_1_0_00000001_for_sum sum;
  anon_class_16_1_54a39818_for_b b;
  uint i;
  uint skip;
  BottomFirstIterator iter;
  anon_class_8_1_01df43c9 addNonCInd;
  Stack<unsigned_int> nonCInd;
  Stack<Kernel::Literal_*> common;
  anon_class_16_1_54a39818_for_withoutX withoutX;
  size_t Csize;
  size_t Ksize;
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *K;
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *L;
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *J;
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *I;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  x;
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *in_stack_fffffffffffff588;
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *in_stack_fffffffffffff590;
  anon_class_184_10_db932ed9_for__func *this_00;
  uint *in_stack_fffffffffffff598;
  Stack<Kernel::Literal_*> *in_stack_fffffffffffff5a0;
  TermList in_stack_fffffffffffff5a8;
  TermList in_stack_fffffffffffff5b0;
  TermList in_stack_fffffffffffff5c0;
  uint in_stack_fffffffffffff5c8;
  undefined4 in_stack_fffffffffffff5cc;
  undefined4 in_stack_fffffffffffff5f8;
  undefined4 in_stack_fffffffffffff5fc;
  anon_class_8_1_01df43c9 *in_stack_fffffffffffff600;
  undefined4 in_stack_fffffffffffff608;
  Elem in_stack_fffffffffffff60c;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:250:15),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:251:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:252:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>_>
  *in_stack_fffffffffffff628;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:250:15),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:251:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:252:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>_>
  *in_stack_fffffffffffff630;
  TermList in_stack_fffffffffffff638;
  TermList in_stack_fffffffffffff640;
  anon_class_1_0_00000001_for_sum *in_stack_fffffffffffff648;
  anon_class_1_0_00000001_for_sum *local_9b0;
  TermList in_stack_fffffffffffff680;
  TermList in_stack_fffffffffffff688;
  code *local_968;
  TermList in_stack_fffffffffffff6c8;
  code *local_920;
  uint local_8f4;
  uint local_8dc;
  anon_class_184_10_db932ed9_for__func *in_stack_fffffffffffff7d0;
  IterTraits<Inferences::ALASCA::PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>_>
  *in_stack_fffffffffffff7d8;
  RangeIterator<unsigned_int> local_460;
  RangeIterator<unsigned_int> *local_450;
  Elem local_448;
  undefined4 local_444;
  RangeIterator<unsigned_int> local_420;
  RangeIterator<unsigned_int> local_410;
  RangeIterator<unsigned_int> local_400;
  RangeIterator<unsigned_int> local_3f0;
  RangeIterator<unsigned_int> local_3e0;
  RangeIterator<unsigned_int> *local_3d0;
  uint64_t local_3c8;
  uint64_t local_340;
  anon_class_1_0_00000001_for_sum *local_338;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_330;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_328;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_320;
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *local_318;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_310;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_308;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_300;
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *local_2f8;
  uint64_t local_2f0;
  uint64_t local_220;
  code *local_218;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_210;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_208;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_200;
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *local_1f8;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_1f0;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_1e8;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_1e0;
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *local_1d8;
  uint64_t local_1d0;
  uint64_t local_148;
  code *local_140;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_138;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_130;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_128;
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *local_120;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_118;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_110;
  FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_108;
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *local_100;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  local_f0;
  uint local_e0;
  uint local_dc;
  BottomFirstIterator local_d8;
  Stack<unsigned_int> *local_c8;
  Stack<unsigned_int> local_b0 [2];
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  local_70;
  long local_60;
  size_t local_58;
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *local_50;
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *local_48;
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *local_40;
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *local_38;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  local_30;
  Clause *local_18;
  
  local_18 = in_RDX;
  Lib::
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  ::Perfect(&local_30,in_RCX);
  local_38 = (Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              *)(in_RCX + 1);
  local_40 = (Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              *)(in_RCX + 3);
  local_48 = (Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              *)(in_RCX + 7);
  local_50 = (Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              *)(in_RCX + 5);
  local_58 = Lib::
             Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
             ::size(local_50);
  if (local_58 != 0) {
    *(int *)(DAT_01333840 + 0x194) = *(int *)(DAT_01333840 + 0x194) + 1;
  }
  *(int *)(DAT_01333840 + 0x198) = *(int *)(DAT_01333840 + 0x198) + (int)local_58;
  if (*(uint *)(DAT_01333840 + 0x19c) < local_58) {
    *(int *)(DAT_01333840 + 0x19c) = (int)local_58;
  }
  uVar2 = Kernel::Clause::size(local_18);
  lVar6 = uVar2 - local_58;
  sVar7 = Lib::
          Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
          ::size(local_38);
  sVar8 = Lib::
          Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
          ::size(local_40);
  sVar9 = Lib::
          Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
          ::size(local_48);
  local_60 = ((lVar6 - sVar7) - sVar8) - sVar9;
  Lib::
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  ::Perfect(&local_70,&local_30);
  Lib::
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  ::size(local_38);
  Lib::
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  ::size(local_40);
  Lib::
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  ::size(local_38);
  Lib::
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  ::size(local_48);
  Lib::
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  ::size(local_40);
  Lib::
  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  ::size(local_48);
  Lib::Stack<Kernel::Literal_*>::Stack(in_stack_fffffffffffff5a0,(size_t)in_stack_fffffffffffff598);
  Lib::Stack<unsigned_int>::Stack
            ((Stack<unsigned_int> *)in_stack_fffffffffffff5a0,(size_t)in_stack_fffffffffffff598);
  local_c8 = local_b0;
  const::{lambda(auto:1&)#1}::operator()
            (in_stack_fffffffffffff600,
             (Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
  const::{lambda(auto:1&)#1}::operator()
            (in_stack_fffffffffffff600,
             (Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
  const::{lambda(auto:1&)#1}::operator()
            (in_stack_fffffffffffff600,
             (Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
  const::{lambda(auto:1&)#1}::operator()
            (in_stack_fffffffffffff600,
             (Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              *)CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
  Lib::Stack<unsigned_int>::begin(local_b0);
  Lib::Stack<unsigned_int>::end(local_b0);
  std::sort<unsigned_int*>((uint *)in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  local_d8 = Lib::Stack<unsigned_int>::iterFifo((Stack<unsigned_int> *)0x7199c2);
  bVar1 = Lib::Stack<unsigned_int>::BottomFirstIterator::hasNext(&local_d8);
  if (bVar1) {
    puVar10 = Lib::Stack<unsigned_int>::BottomFirstIterator::next(&local_d8);
    local_8dc = *puVar10;
    local_9b0 = in_stack_fffffffffffff648;
  }
  else {
    local_8dc = Kernel::Clause::size(local_18);
    local_9b0 = in_stack_fffffffffffff648;
  }
  local_dc = local_8dc;
  local_e0 = 0;
  while( true ) {
    uVar2 = local_e0;
    uVar3 = Kernel::Clause::size(local_18);
    if (uVar3 <= uVar2) break;
    if (local_dc == local_e0) {
      bVar1 = Lib::Stack<unsigned_int>::BottomFirstIterator::hasNext(&local_d8);
      if (bVar1) {
        puVar10 = Lib::Stack<unsigned_int>::BottomFirstIterator::next(&local_d8);
        local_8f4 = *puVar10;
      }
      else {
        local_8f4 = Kernel::Clause::size(local_18);
      }
      local_dc = local_8f4;
    }
    else {
      Kernel::Clause::operator[](local_18,local_e0);
      Lib::Stack<Kernel::Literal_*>::push
                ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffff590,
                 (Literal *)in_stack_fffffffffffff588);
    }
    local_e0 = local_e0 + 1;
  }
  Lib::Stack<unsigned_int>::~Stack((Stack<unsigned_int> *)in_stack_fffffffffffff590);
  Lib::
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  ::Perfect(&local_f0,&local_30);
  local_100 = local_38;
  local_108 = Lib::
              Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              ::begin(local_38);
  local_110 = Lib::
              Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
              ::end(local_100);
  do {
    if (local_108 == local_110) {
      local_1d8 = local_38;
      local_1e0 = Lib::
                  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                  ::begin(local_38);
      local_1e8 = Lib::
                  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                  ::end(local_1d8);
      for (; local_1e0 != local_1e8; local_1e0 = local_1e0 + 1) {
        local_1f0 = local_1e0;
        local_1f8 = local_48;
        local_200 = Lib::
                    Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                    ::begin(local_48);
        local_208 = Lib::
                    Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                    ::end(local_1f8);
        for (; local_200 != local_208; local_200 = local_200 + 1) {
          local_210 = local_200;
          AVar4 = Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>::symbol
                            (&local_1f0->literal);
          if (AVar4 == GREATER) {
            local_968 = Kernel::NumTraits<Kernel::RationalConstantType>::greater;
          }
          else {
            local_968 = Kernel::NumTraits<Kernel::RationalConstantType>::geq;
          }
          local_218 = local_968;
          const::{lambda(auto:1&)#2}::operator()
                    ((anon_class_16_1_54a39818_for_b *)in_stack_fffffffffffff688._content,
                     (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                     in_stack_fffffffffffff680._content);
          const::{lambda(auto:1&)#2}::operator()
                    ((anon_class_16_1_54a39818_for_b *)in_stack_fffffffffffff688._content,
                     (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                     in_stack_fffffffffffff680._content);
          const::{lambda(auto:1)#2}::operator()
                    ((anon_class_1_0_00000001_for_minus *)in_stack_fffffffffffff5a8._content,
                     (IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:250:15),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:251:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:252:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>_>
                      *)in_stack_fffffffffffff5a0);
          in_stack_fffffffffffff688 =
               const::{lambda(auto:1,auto:2)#1}::operator()
                         (local_9b0,in_stack_fffffffffffff640._content,
                          in_stack_fffffffffffff638._content);
          local_220 = in_stack_fffffffffffff688._content;
          in_stack_fffffffffffff680 = Kernel::NumTraits<Kernel::RationalConstantType>::zero();
          local_2f0 = in_stack_fffffffffffff680._content;
          (*local_968)(1,local_220,in_stack_fffffffffffff680._content);
          Lib::Stack<Kernel::Literal_*>::push
                    ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffff590,
                     (Literal *)in_stack_fffffffffffff588);
        }
      }
      local_2f8 = local_40;
      local_300 = Lib::
                  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                  ::begin(local_40);
      local_308 = Lib::
                  Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                  ::end(local_2f8);
      for (; local_300 != local_308; local_300 = local_300 + 1) {
        local_310 = local_300;
        local_318 = local_48;
        local_320 = Lib::
                    Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                    ::begin(local_48);
        local_328 = Lib::
                    Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                    ::end(local_318);
        for (; local_320 != local_328; local_320 = local_320 + 1) {
          local_330 = local_320;
          AVar4 = Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>::symbol
                            (&local_310->literal);
          if (AVar4 == GREATER) {
            local_9b0 = (anon_class_1_0_00000001_for_sum *)
                        Kernel::NumTraits<Kernel::RationalConstantType>::greater;
          }
          else {
            local_9b0 = (anon_class_1_0_00000001_for_sum *)
                        Kernel::NumTraits<Kernel::RationalConstantType>::geq;
          }
          local_338 = local_9b0;
          const::{lambda(auto:1&)#2}::operator()
                    ((anon_class_16_1_54a39818_for_b *)in_stack_fffffffffffff688._content,
                     (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                     in_stack_fffffffffffff680._content);
          const::{lambda(auto:1&)#2}::operator()
                    ((anon_class_16_1_54a39818_for_b *)in_stack_fffffffffffff688._content,
                     (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                     in_stack_fffffffffffff680._content);
          in_stack_fffffffffffff640 =
               const::{lambda(auto:1,auto:2)#1}::operator()
                         (in_stack_fffffffffffff638._content,in_stack_fffffffffffff630,
                          in_stack_fffffffffffff628);
          local_340 = in_stack_fffffffffffff640._content;
          in_stack_fffffffffffff638 = Kernel::NumTraits<Kernel::RationalConstantType>::zero();
          local_3c8 = in_stack_fffffffffffff638._content;
          in_stack_fffffffffffff630 =
               (IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:250:15),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:251:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:252:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>_>
                *)(*(code *)local_9b0)(1,local_340,in_stack_fffffffffffff638._content);
          Lib::Stack<Kernel::Literal_*>::push
                    ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffff590,
                     (Literal *)in_stack_fffffffffffff588);
        }
      }
      Lib::
      Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
      ::size(local_48);
      local_410 = Lib::getRangeIterator<unsigned_int>
                            ((uint)in_stack_fffffffffffff598,
                             (uint)((ulong)in_stack_fffffffffffff590 >> 0x20));
      RVar12._to = in_stack_fffffffffffff5c8;
      RVar12._next = (int)in_stack_fffffffffffff5c0._content;
      RVar12._from = (int)(in_stack_fffffffffffff5c0._content >> 0x20);
      local_400 = local_410;
      local_3f0 = local_410;
      local_420 = (RangeIterator<unsigned_int>)
                  Lib::iterTraits<Lib::RangeIterator<unsigned_int>>(RVar12);
      local_3d0 = &local_3e0;
      local_3e0 = local_420;
      Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>::begin
                ((IterTraits<Lib::RangeIterator<unsigned_int>_> *)in_stack_fffffffffffff588);
      Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>::end
                ((IterTraits<Lib::RangeIterator<unsigned_int>_> *)in_stack_fffffffffffff588);
      while( true ) {
        bVar1 = Lib::operator!=((StlIter *)in_stack_fffffffffffff590,
                                (StlIter *)in_stack_fffffffffffff588);
        if (!bVar1) break;
        in_stack_fffffffffffff60c =
             Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>::StlIter::operator*
                       ((StlIter *)0x71a4eb);
        local_448 = in_stack_fffffffffffff60c;
        Lib::
        Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
        ::size(local_48);
        Lib::getRangeIterator<unsigned_int>
                  ((uint)in_stack_fffffffffffff598,(uint)((ulong)in_stack_fffffffffffff590 >> 0x20))
        ;
        i_00._to = in_stack_fffffffffffff5c8;
        i_00._next = (int)in_stack_fffffffffffff5c0._content;
        i_00._from = (int)(in_stack_fffffffffffff5c0._content >> 0x20);
        RVar12 = (RangeIterator<unsigned_int>)
                 Lib::iterTraits<Lib::RangeIterator<unsigned_int>>(i_00);
        local_450 = &local_460;
        local_460 = RVar12;
        Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>::begin
                  ((IterTraits<Lib::RangeIterator<unsigned_int>_> *)in_stack_fffffffffffff588);
        Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>::end
                  ((IterTraits<Lib::RangeIterator<unsigned_int>_> *)in_stack_fffffffffffff588);
        while( true ) {
          bVar1 = Lib::operator!=((StlIter *)in_stack_fffffffffffff590,
                                  (StlIter *)in_stack_fffffffffffff588);
          if (!bVar1) break;
          EVar5 = Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>::StlIter::operator*
                            ((StlIter *)0x71a6b6);
          Lib::
          Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
          ::operator[](local_48,(ulong)local_448);
          Lib::
          Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
          ::operator[](local_48,(ulong)EVar5);
          const::{lambda(auto:1&)#2}::operator()
                    ((anon_class_16_1_54a39818_for_b *)in_stack_fffffffffffff688._content,
                     (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                     in_stack_fffffffffffff680._content);
          const::{lambda(auto:1&)#2}::operator()
                    ((anon_class_16_1_54a39818_for_b *)in_stack_fffffffffffff688._content,
                     (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                     in_stack_fffffffffffff680._content);
          const::{lambda(auto:1)#2}::operator()
                    ((anon_class_1_0_00000001_for_minus *)in_stack_fffffffffffff5a8._content,
                     (IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::FilteredIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:250:15),_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:251:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:252:12),_Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>_>
                      *)in_stack_fffffffffffff5a0);
          TVar11 = const::{lambda(auto:1,auto:2)#1}::operator()
                             (local_9b0,in_stack_fffffffffffff640._content,
                              in_stack_fffffffffffff638._content);
          in_stack_fffffffffffff5c8 = (uint)TVar11._content;
          in_stack_fffffffffffff5cc = (undefined4)(TVar11._content >> 0x20);
          in_stack_fffffffffffff5c0 = Kernel::NumTraits<Kernel::RationalConstantType>::zero();
          Kernel::NumTraits<Kernel::RationalConstantType>::eq
                    (SUB81((ulong)in_stack_fffffffffffff5a0 >> 0x38,0),in_stack_fffffffffffff5b0,
                     in_stack_fffffffffffff5a8);
          Lib::Stack<Kernel::Literal_*>::push
                    ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffff590,
                     (Literal *)in_stack_fffffffffffff588);
          Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>::StlIter::operator++
                    ((StlIter *)in_stack_fffffffffffff5b0._content);
        }
        local_444 = 0x13;
        Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>::StlIter::~StlIter((StlIter *)0x71a658);
        Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>::StlIter::~StlIter((StlIter *)0x71a665);
        Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>::StlIter::operator++
                  ((StlIter *)in_stack_fffffffffffff5b0._content);
      }
      local_444 = 0x11;
      Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>::StlIter::~StlIter((StlIter *)0x71a49a);
      Lib::IterTraits<Lib::RangeIterator<unsigned_int>_>::StlIter::~StlIter((StlIter *)0x71a4a7);
      Lib::
      Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
      ::Stack(in_stack_fffffffffffff590,in_stack_fffffffffffff588);
      partitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>>>
                ((Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                  *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
      Lib::
      iterTraits<Inferences::ALASCA::PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>>>>
                ((PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                  *)CONCAT44(in_stack_fffffffffffff60c,in_stack_fffffffffffff608));
      this_00 = (anon_class_184_10_db932ed9_for__func *)&stack0xfffffffffffff7b8;
      Lib::Stack<Kernel::Literal_*>::Stack
                ((Stack<Kernel::Literal_*> *)this_00,
                 (Stack<Kernel::Literal_*> *)in_stack_fffffffffffff588);
      Lib::
      Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
      ::Stack((Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
               *)this_00,in_stack_fffffffffffff588);
      Lib::
      Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
      ::Stack((Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
               *)this_00,in_stack_fffffffffffff588);
      Lib::
      Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
      ::Stack((Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
               *)this_00,in_stack_fffffffffffff588);
      const::{lambda(auto:1)#1}::FoundVariable
                ((anon_class_16_1_54a39818_for_withoutX *)this_00,
                 (anon_class_16_1_54a39818_for_withoutX *)in_stack_fffffffffffff588);
      const::{lambda(auto:1&)#2}::FoundVariable
                ((anon_class_16_1_54a39818_for_b *)this_00,
                 (anon_class_16_1_54a39818_for_b *)in_stack_fffffffffffff588);
      Lib::
      IterTraits<Inferences::ALASCA::PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>>>>
      ::
      map<Inferences::ALASCA::VariableElimination::applyRule<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::Clause*,Inferences::ALASCA::VariableElimination::FoundVariable<Kernel::NumTraits<Kernel::RationalConstantType>>)const::_lambda(auto:1&)_3_>
                (in_stack_fffffffffffff7d8,in_stack_fffffffffffff7d0);
      Lib::
      pvi<Lib::IterTraits<Lib::MappingIterator<Inferences::ALASCA::PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>>>,Inferences::ALASCA::VariableElimination::applyRule<Kernel::NumTraits<Kernel::RationalConstantType>>(Kernel::Clause*,Inferences::ALASCA::VariableElimination::FoundVariable<Kernel::NumTraits<Kernel::RationalConstantType>>)const::_lambda(auto:1&)_3_,Kernel::Clause*>>>
                ((IterTraits<Lib::MappingIterator<Inferences::ALASCA::PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:313:12),_Kernel::Clause_*>_>
                  *)in_stack_fffffffffffff6c8._content);
      Lib::
      IterTraits<Lib::MappingIterator<Inferences::ALASCA::PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ALASCA/VariableElimination.cpp:313:12),_Kernel::Clause_*>_>
      ::~IterTraits((IterTraits<Lib::MappingIterator<Inferences::ALASCA::PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ALASCA_VariableElimination_cpp:313:12),_Kernel::Clause_*>_>
                     *)0x71a98c);
      const::{lambda(auto:1&)#3}::~FoundVariable(this_00);
      Lib::
      IterTraits<Inferences::ALASCA::PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>_>
      ::~IterTraits((IterTraits<Inferences::ALASCA::PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>_>
                     *)0x71a9a6);
      PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
      ::~PartitionIter((PartitionIter<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                        *)this_00);
      Lib::
      Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
      ::~Stack((Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                *)this_00);
      local_444 = 1;
      Lib::Stack<Kernel::Literal_*>::~Stack(&this_00->common);
      return (ClauseIterator)in_RDI;
    }
    local_118 = local_108;
    local_120 = local_40;
    local_128 = Lib::
                Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                ::begin(local_40);
    local_130 = Lib::
                Stack<Inferences::ALASCA::VariableElimination::FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                ::end(local_120);
    for (; local_128 != local_130; local_128 = local_128 + 1) {
      local_138 = local_128;
      AVar4 = Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>::symbol
                        (&local_118->literal);
      if (AVar4 == GREATER) {
        AVar4 = Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>::symbol
                          (&local_138->literal);
        if (AVar4 != GREATER) goto LAB_00719d07;
        local_920 = Kernel::NumTraits<Kernel::RationalConstantType>::greater;
      }
      else {
LAB_00719d07:
        local_920 = Kernel::NumTraits<Kernel::RationalConstantType>::geq;
      }
      local_140 = local_920;
      const::{lambda(auto:1&)#2}::operator()
                ((anon_class_16_1_54a39818_for_b *)in_stack_fffffffffffff688._content,
                 (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                 in_stack_fffffffffffff680._content);
      const::{lambda(auto:1&)#2}::operator()
                ((anon_class_16_1_54a39818_for_b *)in_stack_fffffffffffff688._content,
                 (FoundVarInLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_> *)
                 in_stack_fffffffffffff680._content);
      local_148 = (uint64_t)
                  const::{lambda(auto:1,auto:2)#1}::operator()
                            (in_stack_fffffffffffff638._content,in_stack_fffffffffffff630,
                             in_stack_fffffffffffff628);
      in_stack_fffffffffffff6c8 = Kernel::NumTraits<Kernel::RationalConstantType>::zero();
      local_1d0 = in_stack_fffffffffffff6c8._content;
      (*local_920)(1,local_148,in_stack_fffffffffffff6c8._content);
      Lib::Stack<Kernel::Literal_*>::push
                ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffff590,
                 (Literal *)in_stack_fffffffffffff588);
    }
    local_108 = local_108 + 1;
  } while( true );
}

Assistant:

ClauseIterator VariableElimination::applyRule(Clause* premise, FoundVariable<NumTraits> found) const
{
  TIME_TRACE("alasca vampire elimination")
  using Numeral = typename NumTraits::ConstantType;
  auto x = found.var;
  DEBUG("eliminating var: ", x)
  auto& I = found.posIneq;
  auto& J = found.negIneq;
  auto& L = found.neq;
  auto& K = found.eq;
  auto Ksize = K.size();

  if (Ksize > 0) {
    env.statistics->alascaVarElimKNonZeroCnt++;
  }
  env.statistics->alascaVarElimKSum += Ksize;
  if (Ksize > env.statistics->alascaVarElimKMax)
    env.statistics->alascaVarElimKMax = Ksize;

  auto Csize = premise->size() - Ksize - I.size() - J.size() - L.size();

  auto withoutX = [x](auto foundVarInLiteral) 
    { return foundVarInLiteral.literal.term().iterSummands()
                              .filter([&](auto monom) { return monom.factors != x; }); };


  Stack<Literal*> common(Csize + I.size() * J.size() + I.size() * L.size() + J.size() * L.size());

  { /* adding C */

    Stack<unsigned> nonCInd;
    auto addNonCInd = [&](auto& x) { for (auto idxd : x) { nonCInd.push(idxd.idx); } };
    addNonCInd(found.eq);
    addNonCInd(found.neq);
    addNonCInd(found.posIneq);
    addNonCInd(found.negIneq);
    std::sort(nonCInd.begin(), nonCInd.end());

    auto iter = nonCInd.iterFifo();
    auto skip = iter.hasNext() ? iter.next() : premise->size();
    for (unsigned i = 0; i < premise->size(); i++) {
      if (skip == i) {
        skip = iter.hasNext() ? iter.next() : premise->size();
      } else {
        ASS(skip > i)
        common.push((*premise)[i]);
      }
    }
  }

  auto b = [x](auto& i) {
    return iterTraits(i.literal.term().iterSummands())
      .filter([&](auto monom) { return monom.factors != x; })
      .map([&](auto t) { return (t / i.numeral.abs()); })
      .map([&](auto t) { return (i.literal.symbol() == AlascaPredicate::EQ || i.literal.symbol() == AlascaPredicate::NEQ) && i.numeral.isNegative()
                                ? -t : t; });
  };

  auto sum = [](auto l, auto r) {
    return NumTraits::sum(
      l.map([](auto monom){ return monom.denormalize(); }),
      r.map([](auto monom){ return monom.denormalize(); })); };

  auto minus = [](auto i) { return i.map([](auto monom) { return Numeral(-1) * monom; }); };

  { 
    // adding { bi + bj >ij 0 | i ∈ I, j ∈ J } 
    for (auto& i : I) {
      for (auto& j : J) {
        auto gr = i.literal.symbol() == AlascaPredicate::GREATER && j.literal.symbol() == AlascaPredicate::GREATER 
          ?  NumTraits::greater
          : NumTraits::geq;
        ASS(i.numeral.isPositive())
        ASS(j.numeral.isNegative())

        common.push(gr(true, sum(b(i), b(j)), NumTraits::zero()));
      }
    }
  }

  {
    // adding {  bi - bl  >i 0 |  i ∈ I,  l ∈ L }
    for (auto& i : I) {
      for (auto& l : L) {
        auto gr = i.literal.symbol() == AlascaPredicate::GREATER ? NumTraits::greater
                                                              : NumTraits::geq;
        common.push(gr(true, sum(b(i), minus(b(l))), NumTraits::zero()));
      }
    }
  }

  {
    // adding {  bj + bl  >j 0 |  j ∈ J,  l ∈ L }
    for (auto& j : J) {
      for (auto& l : L) {
        auto gr = j.literal.symbol() == AlascaPredicate::GREATER ? NumTraits::greater
                                                              : NumTraits::geq;
        common.push(gr(true, sum(b(j), b(l)), NumTraits::zero()));
      }
    }
  }

  { // adding { bl1 - bl2 /= 0 | ordered pairs (l1, l2) of L }
    // TODO write a test for me
    for (auto i1 : iterTraits(getRangeIterator(0u, (unsigned)L.size()))) {
      for (auto i2 : iterTraits(getRangeIterator(i1 + 1, (unsigned)L.size()))) {
        auto& l1 = L[i1];
        auto& l2 = L[i2];
        common.push(NumTraits::eq(false, sum(b(l1), minus(b(l2))), NumTraits::zero()));
      }
    }
  }


  return pvi(iterTraits(partitionIter(std::move(K)))
      .map([common = std::move(common), 
            I = std::move(I), 
            J = std::move(J), 
            L = std::move(L), 
            withoutX, 
            premise, 
            Ksize,
            sum, minus, b](auto& par) {

        auto Kp = [&]() { return par.partition(0);};
        auto Km = [&]() { return par.partition(1); };

        auto Kpsize = par.partitionSize(0);
        auto Kmsize = Ksize - Kpsize;

        Stack<Literal*> concl(common.size() + I.size() * Kpsize + + J.size() * Kmsize);
        concl.loadFromIterator(common.iterFifo());

        // adding {  bi - bk  >= 0 |   i ∈ I,   k ∈ Km }
        for (auto& k : Km()) {
          for (auto& i : I) {
            concl.push(NumTraits::geq(true, sum(b(i), minus(b(k))), NumTraits::zero()));
          }
        }

        // adding {  bj + bk  >= 0 |   j ∈ J,   k ∈ Kp }
        for (auto& k : Kp()) {
          for (auto& j : J) {
            concl.push(NumTraits::geq(true, sum(b(j), b(k)), NumTraits::zero()));
          }
        }

        // adding { bk1 - bk2 >= 0 |  k1 ∈ Kp, k2 ∈ Km }
        for (auto& k1 : Kp()) {
          for (auto& k2 : Km()) {
            // TODO test me
            concl.push(NumTraits::geq(true, sum(b(k1), minus(b(k2))), NumTraits::zero()));
          }
        }

        // adding {  bk - bl  >= 0 |  k ∈ Kp, l ∈ L }
        for (auto& k : Kp()) {
          for (auto& l : L) {
            // TODO test me
            concl.push(NumTraits::geq(true, sum(b(k), minus(b(l))), NumTraits::zero()));
          }
        }

        // adding {  bl - bk  >= 0 |  k ∈ Km, l ∈ L }
        for (auto& k : Km()) {
          for (auto& l : L) {
            // TODO test me
            concl.push(NumTraits::geq(true, sum(b(l), minus(b(k))), NumTraits::zero()));
          }
        }

        Inference inf(GeneratingInference1(Kernel::InferenceRule::ALASCA_VARIABLE_ELIMINATION, premise));
        auto out = Clause::fromStack(concl, inf);
        return out;
      }));
}